

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O1

void zCompRow_to_CompCol(int m,int n,int_t nnz,doublecomplex *a,int_t *colind,int_t *rowptr,
                        doublecomplex **at,int_t **rowind,int_t **colptr)

{
  int iVar1;
  int iVar2;
  int_t *piVar3;
  doublecomplex *pdVar4;
  double dVar5;
  doublecomplex *pdVar6;
  int_t *piVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  pdVar6 = doublecomplexMalloc((long)nnz);
  *at = pdVar6;
  piVar7 = intMalloc(nnz);
  *rowind = piVar7;
  piVar7 = intMalloc(n + 1);
  *colptr = piVar7;
  piVar7 = intCalloc(n);
  if (0 < m) {
    uVar9 = 0;
    do {
      lVar10 = (long)rowptr[uVar9];
      uVar8 = uVar9 + 1;
      if (rowptr[uVar9] < rowptr[uVar9 + 1]) {
        do {
          piVar7[colind[lVar10]] = piVar7[colind[lVar10]] + 1;
          lVar10 = lVar10 + 1;
        } while (lVar10 < rowptr[uVar8]);
      }
      uVar9 = uVar8;
    } while (uVar8 != (uint)m);
  }
  piVar3 = *colptr;
  *piVar3 = 0;
  if (0 < n) {
    uVar9 = 0;
    do {
      piVar3[uVar9 + 1] = piVar7[uVar9] + piVar3[uVar9];
      piVar7[uVar9] = piVar3[uVar9];
      uVar9 = uVar9 + 1;
    } while ((uint)n != uVar9);
  }
  if (0 < m) {
    uVar9 = 0;
    do {
      lVar10 = (long)rowptr[uVar9];
      uVar8 = uVar9 + 1;
      if (rowptr[uVar9] < rowptr[uVar9 + 1]) {
        pdVar6 = a + lVar10;
        do {
          iVar1 = colind[lVar10];
          iVar2 = piVar7[iVar1];
          (*rowind)[iVar2] = (int_t)uVar9;
          pdVar4 = *at;
          dVar5 = pdVar6->i;
          pdVar4[iVar2].r = pdVar6->r;
          pdVar4[iVar2].i = dVar5;
          piVar7[iVar1] = piVar7[iVar1] + 1;
          lVar10 = lVar10 + 1;
          pdVar6 = pdVar6 + 1;
        } while (lVar10 < rowptr[uVar8]);
      }
      uVar9 = uVar8;
    } while (uVar8 != (uint)m);
  }
  superlu_free(piVar7);
  return;
}

Assistant:

void
zCompRow_to_CompCol(int m, int n, int_t nnz, 
		    doublecomplex *a, int_t *colind, int_t *rowptr,
		    doublecomplex **at, int_t **rowind, int_t **colptr)
{
    register int i, j, col, relpos;
    int_t *marker;

    /* Allocate storage for another copy of the matrix. */
    *at = (doublecomplex *) doublecomplexMalloc(nnz);
    *rowind = (int_t *) intMalloc(nnz);
    *colptr = (int_t *) intMalloc(n+1);
    marker = (int_t *) intCalloc(n);
    
    /* Get counts of each column of A, and set up column pointers */
    for (i = 0; i < m; ++i)
	for (j = rowptr[i]; j < rowptr[i+1]; ++j) ++marker[colind[j]];
    (*colptr)[0] = 0;
    for (j = 0; j < n; ++j) {
	(*colptr)[j+1] = (*colptr)[j] + marker[j];
	marker[j] = (*colptr)[j];
    }

    /* Transfer the matrix into the compressed column storage. */
    for (i = 0; i < m; ++i) {
	for (j = rowptr[i]; j < rowptr[i+1]; ++j) {
	    col = colind[j];
	    relpos = marker[col];
	    (*rowind)[relpos] = i;
	    (*at)[relpos] = a[j];
	    ++marker[col];
	}
    }

    SUPERLU_FREE(marker);
}